

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  int more;
  cTValue *t;
  int idx_local;
  lua_State *L_local;
  
  pTVar2 = index2adr(L,idx);
  iVar1 = lj_tab_next((GCtab *)(pTVar2->u64 & 0x7fffffffffff),L->top + -1,L->top + -1);
  if (iVar1 < 1) {
    if (iVar1 != 0) {
      lj_err_msg(L,LJ_ERR_NEXTIDX);
    }
    L->top = L->top + -1;
  }
  else {
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    if ((TValue *)(L->maxstack).ptr64 <= pTVar2 + 1) {
      lj_state_growstack1(L);
    }
  }
  return iVar1;
}

Assistant:

LUA_API int lua_next(lua_State *L, int idx)
{
  cTValue *t = index2adr(L, idx);
  int more;
  lj_checkapi(tvistab(t), "stack slot %d is not a table", idx);
  more = lj_tab_next(tabV(t), L->top-1, L->top-1);
  if (more > 0) {
    incr_top(L);  /* Return new key and value slot. */
  } else if (!more) {  /* End of traversal. */
    L->top--;  /* Remove key slot. */
  } else {
    lj_err_msg(L, LJ_ERR_NEXTIDX);
  }
  return more;
}